

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

HeapprofdConfig * __thiscall
perfetto::protos::gen::HeapprofdConfig::operator=(HeapprofdConfig *this,HeapprofdConfig *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  bool bVar6;
  undefined2 uVar7;
  undefined3 uVar8;
  
  this->adaptive_sampling_max_sampling_interval_bytes_ =
       param_1->adaptive_sampling_max_sampling_interval_bytes_;
  uVar1 = *(undefined4 *)((long)&param_1->sampling_interval_bytes_ + 4);
  uVar5 = param_1->adaptive_sampling_shmem_threshold_;
  uVar2 = *(undefined4 *)((long)&param_1->adaptive_sampling_shmem_threshold_ + 4);
  *(int *)&this->sampling_interval_bytes_ = (int)param_1->sampling_interval_bytes_;
  *(undefined4 *)((long)&this->sampling_interval_bytes_ + 4) = uVar1;
  *(int *)&this->adaptive_sampling_shmem_threshold_ = (int)uVar5;
  *(undefined4 *)((long)&this->adaptive_sampling_shmem_threshold_ + 4) = uVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->process_cmdline_,&param_1->process_cmdline_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->pid_,&param_1->pid_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->target_installed_by_,&param_1->target_installed_by_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->heaps_,&param_1->heaps_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->exclude_heaps_,&param_1->exclude_heaps_);
  this->stream_allocations_ = param_1->stream_allocations_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->heap_sampling_intervals_,&param_1->heap_sampling_intervals_);
  this->max_heapprofd_cpu_secs_ = param_1->max_heapprofd_cpu_secs_;
  bVar6 = param_1->all_;
  uVar7 = *(undefined2 *)&param_1->field_0xba;
  uVar3 = param_1->min_anonymous_memory_kb_;
  uVar4 = param_1->max_heapprofd_memory_kb_;
  uVar1 = *(undefined4 *)&param_1->field_0xc4;
  this->all_heaps_ = param_1->all_heaps_;
  this->all_ = bVar6;
  *(undefined2 *)&this->field_0xba = uVar7;
  this->min_anonymous_memory_kb_ = uVar3;
  this->max_heapprofd_memory_kb_ = uVar4;
  *(undefined4 *)&this->field_0xc4 = uVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->skip_symbol_prefix_,&param_1->skip_symbol_prefix_);
  protozero::CopyablePtr<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>::operator=
            (&this->continuous_dump_config_,&param_1->continuous_dump_config_);
  bVar6 = param_1->block_client_;
  uVar8 = *(undefined3 *)&param_1->field_0xf9;
  uVar3 = param_1->block_client_timeout_us_;
  this->shmem_size_bytes_ = param_1->shmem_size_bytes_;
  this->block_client_ = bVar6;
  *(undefined3 *)&this->field_0xf9 = uVar8;
  this->block_client_timeout_us_ = uVar3;
  *(undefined8 *)((long)&this->block_client_timeout_us_ + 1) =
       *(undefined8 *)((long)&param_1->block_client_timeout_us_ + 1);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool HeapprofdConfig::operator==(const HeapprofdConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && sampling_interval_bytes_ == other.sampling_interval_bytes_
   && adaptive_sampling_shmem_threshold_ == other.adaptive_sampling_shmem_threshold_
   && adaptive_sampling_max_sampling_interval_bytes_ == other.adaptive_sampling_max_sampling_interval_bytes_
   && process_cmdline_ == other.process_cmdline_
   && pid_ == other.pid_
   && target_installed_by_ == other.target_installed_by_
   && heaps_ == other.heaps_
   && exclude_heaps_ == other.exclude_heaps_
   && stream_allocations_ == other.stream_allocations_
   && heap_sampling_intervals_ == other.heap_sampling_intervals_
   && all_heaps_ == other.all_heaps_
   && all_ == other.all_
   && min_anonymous_memory_kb_ == other.min_anonymous_memory_kb_
   && max_heapprofd_memory_kb_ == other.max_heapprofd_memory_kb_
   && max_heapprofd_cpu_secs_ == other.max_heapprofd_cpu_secs_
   && skip_symbol_prefix_ == other.skip_symbol_prefix_
   && continuous_dump_config_ == other.continuous_dump_config_
   && shmem_size_bytes_ == other.shmem_size_bytes_
   && block_client_ == other.block_client_
   && block_client_timeout_us_ == other.block_client_timeout_us_
   && no_startup_ == other.no_startup_
   && no_running_ == other.no_running_
   && dump_at_max_ == other.dump_at_max_
   && disable_fork_teardown_ == other.disable_fork_teardown_
   && disable_vfork_detection_ == other.disable_vfork_detection_;
}